

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11MiniFB.c
# Opt level: O0

void processEvent(SWindowData *window_data,XEvent *event)

{
  _Bool _Var1;
  int iVar2;
  uint32_t uVar3;
  int *in_RSI;
  SWindowData *in_RDI;
  bool bVar4;
  _Bool destroy;
  int is_pressed_1;
  mfb_mouse_button button;
  KeySym keysym;
  int is_pressed;
  mfb_key key_code;
  XEvent nev;
  SWindowData_X11 *window_data_x11;
  int in_stack_fffffffffffffeec;
  SWindowData *in_stack_fffffffffffffef0;
  mfb_mouse_button local_ec;
  ulong local_e8;
  uint local_e0;
  mfb_key local_dc;
  int local_d8 [14];
  long local_a0;
  int local_84;
  void *local_18;
  int *local_10;
  SWindowData *local_8;
  
  local_8 = in_RDI;
  switch(*in_RSI) {
  case 2:
  case 3:
    local_18 = in_RDI->specific;
    local_10 = in_RSI;
    if ((((*in_RSI != 3) ||
         (iVar2 = XEventsQueued(*(undefined8 *)((long)local_18 + 8),1), iVar2 == 0)) ||
        (XPeekEvent(*(undefined8 *)((long)local_18 + 8),local_d8), local_d8[0] != 2)) ||
       ((local_a0 != *(long *)(local_10 + 0xe) || (local_84 != local_10[0x15])))) {
      local_dc = translate_key(local_10[0x15]);
      local_e0 = (uint)(*local_10 == 2);
      uVar3 = translate_mod_ex((int)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                               (int)in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
      local_8->mod_keys = uVar3;
      local_8->key_status[local_dc] = (uint8_t)local_e0;
      if ((local_8 != (SWindowData *)0x0) && (local_8->keyboard_func != (mfb_keyboard_func)0x0)) {
        (*local_8->keyboard_func)((mfb_window *)local_8,local_dc,local_8->mod_keys,local_e0 != 0);
      }
      if (*local_10 == 2) {
        XLookupString(local_10,0,0,&local_e8);
        if (((local_e8 < 0x20) || (0x7e < local_e8)) && ((local_e8 < 0xa0 || (0xff < local_e8)))) {
          if ((local_e8 & 0xff000000) == 0x1000000) {
            local_e8 = local_e8 & 0xffffff;
          }
        }
        else if ((local_8 != (SWindowData *)0x0) &&
                (local_8->char_input_func != (mfb_char_input_func)0x0)) {
          (*local_8->char_input_func)((mfb_window *)local_8,(uint)local_e8);
        }
        if ((local_8 != (SWindowData *)0x0) &&
           (local_8->char_input_func != (mfb_char_input_func)0x0)) {
          (*local_8->char_input_func)((mfb_window *)local_8,(uint)local_e8);
        }
      }
    }
    break;
  case 4:
  case 5:
    local_ec = in_RSI[0x15];
    bVar4 = *in_RSI == 4;
    uVar3 = translate_mod(in_RSI[0x14]);
    local_8->mod_keys = uVar3;
    if (local_ec == MOUSE_BTN_2) {
      local_ec = MOUSE_BTN_3;
    }
    else if (local_ec == MOUSE_BTN_3) {
      local_ec = MOUSE_BTN_2;
    }
    switch(local_ec) {
    case MOUSE_BTN_1:
    case MOUSE_BTN_2:
    case MOUSE_BTN_3:
      local_8->mouse_button_status[local_ec & MOUSE_BTN_7] = bVar4;
      if ((local_8 != (SWindowData *)0x0) && (local_8->mouse_btn_func != (mfb_mouse_button_func)0x0)
         ) {
        (*local_8->mouse_btn_func)((mfb_window *)local_8,local_ec,local_8->mod_keys,bVar4);
      }
      break;
    case MOUSE_BTN_4:
      local_8->mouse_wheel_y = 1.0;
      if ((local_8 != (SWindowData *)0x0) &&
         (local_8->mouse_wheel_func != (mfb_mouse_scroll_func)0x0)) {
        (*local_8->mouse_wheel_func)
                  ((mfb_window *)local_8,local_8->mod_keys,0.0,local_8->mouse_wheel_y);
      }
      break;
    case MOUSE_BTN_5:
      local_8->mouse_wheel_y = -1.0;
      if ((local_8 != (SWindowData *)0x0) &&
         (local_8->mouse_wheel_func != (mfb_mouse_scroll_func)0x0)) {
        (*local_8->mouse_wheel_func)
                  ((mfb_window *)local_8,local_8->mod_keys,0.0,local_8->mouse_wheel_y);
      }
      break;
    case MOUSE_BTN_6:
      local_8->mouse_wheel_x = 1.0;
      if ((local_8 != (SWindowData *)0x0) &&
         (local_8->mouse_wheel_func != (mfb_mouse_scroll_func)0x0)) {
        (*local_8->mouse_wheel_func)
                  ((mfb_window *)local_8,local_8->mod_keys,local_8->mouse_wheel_x,0.0);
      }
      break;
    case MOUSE_BTN_7:
      local_8->mouse_wheel_x = -1.0;
      if ((local_8 != (SWindowData *)0x0) &&
         (local_8->mouse_wheel_func != (mfb_mouse_scroll_func)0x0)) {
        (*local_8->mouse_wheel_func)
                  ((mfb_window *)local_8,local_8->mod_keys,local_8->mouse_wheel_x,0.0);
      }
      break;
    default:
      local_8->mouse_button_status[local_ec - MOUSE_BTN_4 & 7] = bVar4;
      if ((local_8 != (SWindowData *)0x0) && (local_8->mouse_btn_func != (mfb_mouse_button_func)0x0)
         ) {
        (*local_8->mouse_btn_func)
                  ((mfb_window *)local_8,local_ec - MOUSE_BTN_4,local_8->mod_keys,bVar4);
      }
    }
    break;
  case 6:
    in_RDI->mouse_pos_x = in_RSI[0x10];
    in_RDI->mouse_pos_y = in_RSI[0x11];
    if ((in_RDI != (SWindowData *)0x0) && (in_RDI->mouse_move_func != (mfb_mouse_move_func)0x0)) {
      (*in_RDI->mouse_move_func)((mfb_window *)in_RDI,in_RSI[0x10],in_RSI[0x11]);
    }
    break;
  case 7:
  case 8:
    break;
  case 9:
    in_RDI->is_active = true;
    if ((in_RDI != (SWindowData *)0x0) && (in_RDI->active_func != (mfb_active_func)0x0)) {
      (*in_RDI->active_func)((mfb_window *)in_RDI,true);
    }
    break;
  case 10:
    in_RDI->is_active = false;
    if ((in_RDI != (SWindowData *)0x0) && (in_RDI->active_func != (mfb_active_func)0x0)) {
      (*in_RDI->active_func)((mfb_window *)in_RDI,false);
    }
    break;
  case 0x11:
    in_RDI->close = true;
    break;
  case 0x16:
    in_RDI->window_width = in_RSI[0xe];
    in_RDI->window_height = in_RSI[0xf];
    resize_dst(in_RDI,in_RSI[0xe],in_RSI[0xf]);
    resize_GL(in_stack_fffffffffffffef0);
    if ((local_8 != (SWindowData *)0x0) && (local_8->resize_func != (mfb_resize_func)0x0)) {
      (*local_8->resize_func)((mfb_window *)local_8,local_8->window_width,local_8->window_height);
    }
    break;
  case 0x21:
    if ((*(Atom *)(in_RSI + 0xe) == s_delete_window_atom) && (in_RDI != (SWindowData *)0x0)) {
      bVar4 = false;
      if ((in_RDI->close_func == (mfb_close_func)0x0) ||
         (_Var1 = (*in_RDI->close_func)((mfb_window *)in_RDI), _Var1)) {
        bVar4 = true;
      }
      if (bVar4) {
        local_8->close = true;
      }
    }
  }
  return;
}

Assistant:

static void
processEvent(SWindowData *window_data, XEvent *event) {
    switch (event->type) {
        case KeyPress:
        case KeyRelease:
        {
            SWindowData_X11 *window_data_x11 = (SWindowData_X11 *) window_data->specific;
            if ((event->type == KeyRelease) &&
                XEventsQueued(window_data_x11->display, QueuedAfterReading)) {
                XEvent nev;
                XPeekEvent(window_data_x11->display, &nev);

                if ((nev.type == KeyPress) && (nev.xkey.time == event->xkey.time) &&
                    (nev.xkey.keycode == event->xkey.keycode)) {
                    /* Key wasn’t actually released */
                    return;
                }
            }

            mfb_key key_code      = (mfb_key) translate_key(event->xkey.keycode);
            int is_pressed        = (event->type == KeyPress);
            window_data->mod_keys = translate_mod_ex(key_code, event->xkey.state, is_pressed);

            window_data->key_status[key_code] = is_pressed;
            kCall(keyboard_func, key_code, (mfb_key_mod) window_data->mod_keys, is_pressed);

            if(event->type == KeyPress) {
                KeySym keysym;
                XLookupString(&event->xkey, NULL, 0, &keysym, NULL);

                if ((keysym >= 0x0020 && keysym <= 0x007e) ||
                    (keysym >= 0x00a0 && keysym <= 0x00ff)) {
                    kCall(char_input_func, keysym);
                }
                else if ((keysym & 0xff000000) == 0x01000000) {
                    keysym = keysym & 0x00ffffff;
                }

                kCall(char_input_func, keysym);

                // TODO: Investigate a bit more the xkbcommon api

                // This does not seem to be working properly
                //unsigned int codepoint = xkb_state_key_get_utf32(state, keysym);
                //if (codepoint != 0)
                //    kCall(char_input_func, codepoint);
            }
        }
        break;

        case ButtonPress:
        case ButtonRelease:
        {
            mfb_mouse_button button = (mfb_mouse_button) event->xbutton.button;
            int          is_pressed = (event->type == ButtonPress);
            window_data->mod_keys   = translate_mod(event->xkey.state);

            // Swap mouse right and middle for parity with other platforms:
            // https://github.com/emoon/minifb/issues/65
            switch (button) {
                case Button2:
                    button = Button3;
                    break;
                case Button3:
                    button = Button2;
                    break;
            }

            switch (button) {
                case Button1:
                case Button2:
                case Button3:
                    window_data->mouse_button_status[button & 0x07] = is_pressed;
                    kCall(mouse_btn_func, button, (mfb_key_mod) window_data->mod_keys, is_pressed);
                    break;

                case Button4:
                    window_data->mouse_wheel_y = 1.0f;
                    kCall(mouse_wheel_func, (mfb_key_mod) window_data->mod_keys, 0.0f, window_data->mouse_wheel_y);
                    break;
                case Button5:
                    window_data->mouse_wheel_y = -1.0f;
                    kCall(mouse_wheel_func, (mfb_key_mod) window_data->mod_keys, 0.0f, window_data->mouse_wheel_y);
                    break;

                case 6:
                    window_data->mouse_wheel_x = 1.0f;
                    kCall(mouse_wheel_func, (mfb_key_mod) window_data->mod_keys, window_data->mouse_wheel_x, 0.0f);
                    break;
                case 7:
                    window_data->mouse_wheel_x = -1.0f;
                    kCall(mouse_wheel_func, (mfb_key_mod) window_data->mod_keys, window_data->mouse_wheel_x, 0.0f);
                    break;

                default:
                    window_data->mouse_button_status[(button - 4) & 0x07] = is_pressed;
                    kCall(mouse_btn_func, (mfb_mouse_button) (button - 4), (mfb_key_mod) window_data->mod_keys, is_pressed);
                    break;
            }
        }
        break;

        case MotionNotify:
            window_data->mouse_pos_x = event->xmotion.x;
            window_data->mouse_pos_y = event->xmotion.y;
            kCall(mouse_move_func, event->xmotion.x, event->xmotion.y);
            break;

        case ConfigureNotify:
        {
            window_data->window_width  = event->xconfigure.width;
            window_data->window_height = event->xconfigure.height;
            resize_dst(window_data, event->xconfigure.width, event->xconfigure.height);

#if defined(USE_OPENGL_API)
            resize_GL(window_data);
#else
            SWindowData_X11 *window_data_x11 = (SWindowData_X11 *) window_data->specific;
            if(window_data_x11->image_scaler != 0x0) {
                window_data_x11->image_scaler->data = 0x0;
                XDestroyImage(window_data_x11->image_scaler);
                window_data_x11->image_scaler        = 0x0;
                window_data_x11->image_scaler_width  = 0;
                window_data_x11->image_scaler_height = 0;
            }
            XClearWindow(window_data_x11->display, window_data_x11->window);
#endif
            kCall(resize_func, window_data->window_width, window_data->window_height);
        }
        break;

        case EnterNotify:
        case LeaveNotify:
        break;

        case FocusIn:
            window_data->is_active = true;
            kCall(active_func, true);
            break;

        case FocusOut:
            window_data->is_active = false;
            kCall(active_func, false);
            break;

        case DestroyNotify:
            window_data->close = true;
            return;
            break;

        case ClientMessage:
        {
            if ((Atom)event->xclient.data.l[0] == s_delete_window_atom) {
                if (window_data) {
                    bool destroy = false;

                    // Obtain a confirmation of close
                    if (!window_data->close_func || window_data->close_func((struct mfb_window*)window_data)) {
                        destroy = true;
                    }

                    if (destroy) {
                        window_data->close = true;
                        return;
                    }
                }
            }
        }
        break;
    }
}